

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void idct8x8_new_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [16];
  int iVar15;
  uint uVar16;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  undefined1 auVar17 [16];
  int iVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  int iVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  undefined1 auVar26 [16];
  int iVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  int iVar37;
  uint uVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  int iVar43;
  int iVar44;
  undefined1 auVar42 [16];
  int iVar45;
  uint uVar46;
  uint uVar48;
  uint uVar49;
  undefined1 auVar47 [16];
  uint uVar50;
  int iVar51;
  uint uVar52;
  uint uVar53;
  int iVar55;
  uint uVar56;
  uint uVar57;
  int iVar58;
  uint uVar59;
  uint uVar60;
  undefined1 auVar54 [16];
  int iVar61;
  uint uVar62;
  uint uVar63;
  int iVar64;
  uint uVar65;
  int iVar66;
  uint uVar67;
  int iVar68;
  uint uVar69;
  int iVar70;
  uint uVar71;
  int iVar72;
  int iVar74;
  int iVar75;
  __m128i rnding;
  undefined1 auVar73 [16];
  int iVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  int iVar82;
  uint uVar83;
  int iVar86;
  uint uVar87;
  int iVar88;
  uint uVar89;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int iVar90;
  uint uVar91;
  undefined1 auVar92 [16];
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  int local_18;
  int iStack_14;
  int iStack_10;
  int iStack_c;
  
  lVar6 = (long)bit * 0x100;
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x180);
  iVar7 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x1a0);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar6 + 0x240);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar6 + 0x1c0);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar6 + 0x1e0);
  uVar4 = *(undefined4 *)((long)vert_filter_length_chroma + lVar6 + 0x220);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar6 + 0x200);
  iVar10 = -iVar5;
  iVar8 = -iVar13;
  iVar9 = -iVar7;
  iVar11 = 1 << ((char)bit - 1U & 0x1f);
  iVar12 = bd + 6 + (uint)(do_cols == 0) * 2;
  auVar77._4_4_ = uVar1;
  auVar77._0_4_ = uVar1;
  auVar77._8_4_ = uVar1;
  auVar77._12_4_ = uVar1;
  auVar78._4_4_ = iVar10;
  auVar78._0_4_ = iVar10;
  auVar78._8_4_ = iVar10;
  auVar78._12_4_ = iVar10;
  auVar14._4_4_ = uVar2;
  auVar14._0_4_ = uVar2;
  auVar14._8_4_ = uVar2;
  auVar14._12_4_ = uVar2;
  auVar17._4_4_ = iVar8;
  auVar17._0_4_ = iVar8;
  auVar17._8_4_ = iVar8;
  auVar17._12_4_ = iVar8;
  auVar26._4_4_ = iVar13;
  auVar26._0_4_ = iVar13;
  auVar26._8_4_ = iVar13;
  auVar26._12_4_ = iVar13;
  auVar42._4_4_ = iVar5;
  auVar42._0_4_ = iVar5;
  auVar42._8_4_ = iVar5;
  auVar42._12_4_ = iVar5;
  auVar47._4_4_ = uVar3;
  auVar47._0_4_ = uVar3;
  auVar47._8_4_ = uVar3;
  auVar47._12_4_ = uVar3;
  auVar42 = pmulld(auVar42,(undefined1  [16])in[1]);
  auVar54 = pmulld((undefined1  [16])in[1],auVar77);
  auVar80 = pmulld(auVar78,(undefined1  [16])in[7]);
  auVar84 = pmulld((undefined1  [16])in[7],auVar77);
  auVar26 = pmulld(auVar26,(undefined1  [16])in[5]);
  auVar85 = pmulld((undefined1  [16])in[5],auVar14);
  auVar17 = pmulld(auVar17,(undefined1  [16])in[3]);
  auVar77 = pmulld((undefined1  [16])in[3],auVar14);
  auVar14 = pmulld((undefined1  [16])*in,auVar47);
  auVar78 = pmulld((undefined1  [16])in[4],auVar47);
  iVar13 = auVar14._0_4_ + iVar11;
  iVar8 = auVar14._4_4_ + iVar11;
  iVar10 = auVar14._8_4_ + iVar11;
  iVar15 = auVar14._12_4_ + iVar11;
  auVar81._4_4_ = uVar4;
  auVar81._0_4_ = uVar4;
  auVar81._8_4_ = uVar4;
  auVar81._12_4_ = uVar4;
  auVar79._4_4_ = iVar9;
  auVar79._0_4_ = iVar9;
  auVar79._8_4_ = iVar9;
  auVar79._12_4_ = iVar9;
  auVar73._4_4_ = iVar7;
  auVar73._0_4_ = iVar7;
  auVar73._8_4_ = iVar7;
  auVar73._12_4_ = iVar7;
  auVar14 = pmulld(auVar73,(undefined1  [16])in[2]);
  auVar73 = pmulld((undefined1  [16])in[2],auVar81);
  auVar92 = pmulld(auVar79,(undefined1  [16])in[6]);
  auVar79 = ZEXT416((uint)bit);
  iVar5 = 0x8000;
  if (0xf < iVar12) {
    iVar5 = 1 << ((char)iVar12 - 1U & 0x1f);
  }
  iVar7 = -iVar5;
  auVar81 = pmulld((undefined1  [16])in[6],auVar81);
  iVar51 = auVar54._0_4_ + iVar11 + auVar80._0_4_ >> auVar79;
  iVar55 = auVar54._4_4_ + iVar11 + auVar80._4_4_ >> auVar79;
  iVar58 = auVar54._8_4_ + iVar11 + auVar80._8_4_ >> auVar79;
  iVar61 = auVar54._12_4_ + iVar11 + auVar80._12_4_ >> auVar79;
  iVar41 = auVar42._0_4_ + iVar11 + auVar84._0_4_ >> auVar79;
  iVar43 = auVar42._4_4_ + iVar11 + auVar84._4_4_ >> auVar79;
  iVar44 = auVar42._8_4_ + iVar11 + auVar84._8_4_ >> auVar79;
  iVar45 = auVar42._12_4_ + iVar11 + auVar84._12_4_ >> auVar79;
  iVar82 = auVar85._0_4_ + iVar11 + auVar17._0_4_ >> auVar79;
  iVar86 = auVar85._4_4_ + iVar11 + auVar17._4_4_ >> auVar79;
  iVar88 = auVar85._8_4_ + iVar11 + auVar17._8_4_ >> auVar79;
  iVar90 = auVar85._12_4_ + iVar11 + auVar17._12_4_ >> auVar79;
  iVar24 = auVar26._0_4_ + iVar11 + auVar77._0_4_ >> auVar79;
  iVar27 = auVar26._4_4_ + iVar11 + auVar77._4_4_ >> auVar79;
  iVar29 = auVar26._8_4_ + iVar11 + auVar77._8_4_ >> auVar79;
  iVar31 = auVar26._12_4_ + iVar11 + auVar77._12_4_ >> auVar79;
  iVar12 = iVar13 + auVar78._0_4_ >> auVar79;
  iVar18 = iVar8 + auVar78._4_4_ >> auVar79;
  iVar20 = iVar10 + auVar78._8_4_ >> auVar79;
  iVar22 = iVar15 + auVar78._12_4_ >> auVar79;
  iVar13 = iVar13 - auVar78._0_4_ >> auVar79;
  iVar8 = iVar8 - auVar78._4_4_ >> auVar79;
  iVar9 = iVar10 - auVar78._8_4_ >> auVar79;
  iVar10 = iVar15 - auVar78._12_4_ >> auVar79;
  iVar72 = auVar73._0_4_ + iVar11 + auVar92._0_4_ >> auVar79;
  iVar74 = auVar73._4_4_ + iVar11 + auVar92._4_4_ >> auVar79;
  iVar75 = auVar73._8_4_ + iVar11 + auVar92._8_4_ >> auVar79;
  iVar76 = auVar73._12_4_ + iVar11 + auVar92._12_4_ >> auVar79;
  iVar33 = auVar14._0_4_ + iVar11 + auVar81._0_4_ >> auVar79;
  iVar35 = auVar14._4_4_ + iVar11 + auVar81._4_4_ >> auVar79;
  iVar37 = auVar14._8_4_ + iVar11 + auVar81._8_4_ >> auVar79;
  iVar39 = auVar14._12_4_ + iVar11 + auVar81._12_4_ >> auVar79;
  iVar5 = iVar5 + -1;
  iVar64 = iVar82 + iVar51;
  iVar66 = iVar86 + iVar55;
  iVar68 = iVar88 + iVar58;
  iVar70 = iVar90 + iVar61;
  iVar51 = iVar51 - iVar82;
  iVar55 = iVar55 - iVar86;
  iVar58 = iVar58 - iVar88;
  iVar61 = iVar61 - iVar90;
  iVar82 = iVar24 + iVar41;
  iVar86 = iVar27 + iVar43;
  iVar88 = iVar29 + iVar44;
  iVar90 = iVar31 + iVar45;
  iVar41 = iVar41 - iVar24;
  iVar43 = iVar43 - iVar27;
  iVar44 = iVar44 - iVar29;
  iVar45 = iVar45 - iVar31;
  iVar15 = iVar33 + iVar12;
  iVar24 = iVar35 + iVar18;
  iVar27 = iVar37 + iVar20;
  iVar29 = iVar39 + iVar22;
  iVar12 = iVar12 - iVar33;
  iVar18 = iVar18 - iVar35;
  iVar20 = iVar20 - iVar37;
  iVar22 = iVar22 - iVar39;
  iVar31 = iVar72 + iVar13;
  iVar33 = iVar74 + iVar8;
  iVar35 = iVar75 + iVar9;
  iVar37 = iVar76 + iVar10;
  iVar13 = iVar13 - iVar72;
  iVar8 = iVar8 - iVar74;
  iVar9 = iVar9 - iVar75;
  iVar10 = iVar10 - iVar76;
  uVar52 = (uint)(iVar51 < iVar7) * iVar7 | (uint)(iVar51 >= iVar7) * iVar51;
  uVar56 = (uint)(iVar55 < iVar7) * iVar7 | (uint)(iVar55 >= iVar7) * iVar55;
  uVar59 = (uint)(iVar58 < iVar7) * iVar7 | (uint)(iVar58 >= iVar7) * iVar58;
  uVar62 = (uint)(iVar61 < iVar7) * iVar7 | (uint)(iVar61 >= iVar7) * iVar61;
  auVar80._0_4_ = (uint)(iVar5 < (int)uVar52) * iVar5 | (iVar5 >= (int)uVar52) * uVar52;
  auVar80._4_4_ = (uint)(iVar5 < (int)uVar56) * iVar5 | (iVar5 >= (int)uVar56) * uVar56;
  auVar80._8_4_ = (uint)(iVar5 < (int)uVar59) * iVar5 | (iVar5 >= (int)uVar59) * uVar59;
  auVar80._12_4_ = (uint)(iVar5 < (int)uVar62) * iVar5 | (iVar5 >= (int)uVar62) * uVar62;
  uVar52 = (uint)(iVar41 < iVar7) * iVar7 | (uint)(iVar41 >= iVar7) * iVar41;
  uVar56 = (uint)(iVar43 < iVar7) * iVar7 | (uint)(iVar43 >= iVar7) * iVar43;
  uVar59 = (uint)(iVar44 < iVar7) * iVar7 | (uint)(iVar44 >= iVar7) * iVar44;
  uVar62 = (uint)(iVar45 < iVar7) * iVar7 | (uint)(iVar45 >= iVar7) * iVar45;
  auVar54._0_4_ = (uint)(iVar5 < (int)uVar52) * iVar5 | (iVar5 >= (int)uVar52) * uVar52;
  auVar54._4_4_ = (uint)(iVar5 < (int)uVar56) * iVar5 | (iVar5 >= (int)uVar56) * uVar56;
  auVar54._8_4_ = (uint)(iVar5 < (int)uVar59) * iVar5 | (iVar5 >= (int)uVar59) * uVar59;
  auVar54._12_4_ = (uint)(iVar5 < (int)uVar62) * iVar5 | (iVar5 >= (int)uVar62) * uVar62;
  auVar17 = pmulld(auVar80,auVar47);
  auVar14 = pmulld(auVar54,auVar47);
  uVar52 = (uint)(iVar64 < iVar7) * iVar7 | (uint)(iVar64 >= iVar7) * iVar64;
  uVar56 = (uint)(iVar66 < iVar7) * iVar7 | (uint)(iVar66 >= iVar7) * iVar66;
  uVar59 = (uint)(iVar68 < iVar7) * iVar7 | (uint)(iVar68 >= iVar7) * iVar68;
  uVar62 = (uint)(iVar70 < iVar7) * iVar7 | (uint)(iVar70 >= iVar7) * iVar70;
  uVar65 = (uint)(iVar5 < (int)uVar52) * iVar5 | (iVar5 >= (int)uVar52) * uVar52;
  uVar67 = (uint)(iVar5 < (int)uVar56) * iVar5 | (iVar5 >= (int)uVar56) * uVar56;
  uVar69 = (uint)(iVar5 < (int)uVar59) * iVar5 | (iVar5 >= (int)uVar59) * uVar59;
  uVar71 = (uint)(iVar5 < (int)uVar62) * iVar5 | (iVar5 >= (int)uVar62) * uVar62;
  uVar52 = (uint)(iVar82 < iVar7) * iVar7 | (uint)(iVar82 >= iVar7) * iVar82;
  uVar56 = (uint)(iVar86 < iVar7) * iVar7 | (uint)(iVar86 >= iVar7) * iVar86;
  uVar59 = (uint)(iVar88 < iVar7) * iVar7 | (uint)(iVar88 >= iVar7) * iVar88;
  uVar62 = (uint)(iVar90 < iVar7) * iVar7 | (uint)(iVar90 >= iVar7) * iVar90;
  uVar83 = (uint)(iVar5 < (int)uVar52) * iVar5 | (iVar5 >= (int)uVar52) * uVar52;
  uVar87 = (uint)(iVar5 < (int)uVar56) * iVar5 | (iVar5 >= (int)uVar56) * uVar56;
  uVar89 = (uint)(iVar5 < (int)uVar59) * iVar5 | (iVar5 >= (int)uVar59) * uVar59;
  uVar91 = (uint)(iVar5 < (int)uVar62) * iVar5 | (iVar5 >= (int)uVar62) * uVar62;
  uVar52 = (uint)(iVar15 < iVar7) * iVar7 | (uint)(iVar15 >= iVar7) * iVar15;
  uVar56 = (uint)(iVar24 < iVar7) * iVar7 | (uint)(iVar24 >= iVar7) * iVar24;
  uVar59 = (uint)(iVar27 < iVar7) * iVar7 | (uint)(iVar27 >= iVar7) * iVar27;
  uVar62 = (uint)(iVar29 < iVar7) * iVar7 | (uint)(iVar29 >= iVar7) * iVar29;
  uVar25 = (uint)(iVar5 < (int)uVar52) * iVar5 | (iVar5 >= (int)uVar52) * uVar52;
  uVar28 = (uint)(iVar5 < (int)uVar56) * iVar5 | (iVar5 >= (int)uVar56) * uVar56;
  uVar30 = (uint)(iVar5 < (int)uVar59) * iVar5 | (iVar5 >= (int)uVar59) * uVar59;
  uVar32 = (uint)(iVar5 < (int)uVar62) * iVar5 | (iVar5 >= (int)uVar62) * uVar62;
  uVar52 = (uint)(iVar12 < iVar7) * iVar7 | (uint)(iVar12 >= iVar7) * iVar12;
  uVar56 = (uint)(iVar18 < iVar7) * iVar7 | (uint)(iVar18 >= iVar7) * iVar18;
  uVar59 = (uint)(iVar20 < iVar7) * iVar7 | (uint)(iVar20 >= iVar7) * iVar20;
  uVar62 = (uint)(iVar22 < iVar7) * iVar7 | (uint)(iVar22 >= iVar7) * iVar22;
  uVar16 = (uint)(iVar5 < (int)uVar52) * iVar5 | (iVar5 >= (int)uVar52) * uVar52;
  uVar19 = (uint)(iVar5 < (int)uVar56) * iVar5 | (iVar5 >= (int)uVar56) * uVar56;
  uVar21 = (uint)(iVar5 < (int)uVar59) * iVar5 | (iVar5 >= (int)uVar59) * uVar59;
  uVar23 = (uint)(iVar5 < (int)uVar62) * iVar5 | (iVar5 >= (int)uVar62) * uVar62;
  uVar52 = (uint)(iVar31 < iVar7) * iVar7 | (uint)(iVar31 >= iVar7) * iVar31;
  uVar56 = (uint)(iVar33 < iVar7) * iVar7 | (uint)(iVar33 >= iVar7) * iVar33;
  uVar59 = (uint)(iVar35 < iVar7) * iVar7 | (uint)(iVar35 >= iVar7) * iVar35;
  uVar62 = (uint)(iVar37 < iVar7) * iVar7 | (uint)(iVar37 >= iVar7) * iVar37;
  uVar34 = (uint)(iVar5 < (int)uVar52) * iVar5 | (iVar5 >= (int)uVar52) * uVar52;
  uVar36 = (uint)(iVar5 < (int)uVar56) * iVar5 | (iVar5 >= (int)uVar56) * uVar56;
  uVar38 = (uint)(iVar5 < (int)uVar59) * iVar5 | (iVar5 >= (int)uVar59) * uVar59;
  uVar40 = (uint)(iVar5 < (int)uVar62) * iVar5 | (iVar5 >= (int)uVar62) * uVar62;
  uVar52 = (uint)(iVar13 < iVar7) * iVar7 | (uint)(iVar13 >= iVar7) * iVar13;
  uVar56 = (uint)(iVar8 < iVar7) * iVar7 | (uint)(iVar8 >= iVar7) * iVar8;
  uVar59 = (uint)(iVar9 < iVar7) * iVar7 | (uint)(iVar9 >= iVar7) * iVar9;
  uVar62 = (uint)(iVar10 < iVar7) * iVar7 | (uint)(iVar10 >= iVar7) * iVar10;
  iVar37 = auVar17._0_4_ + iVar11 + auVar14._0_4_ >> auVar79;
  iVar39 = auVar17._4_4_ + iVar11 + auVar14._4_4_ >> auVar79;
  iVar41 = auVar17._8_4_ + iVar11 + auVar14._8_4_ >> auVar79;
  iVar43 = auVar17._12_4_ + iVar11 + auVar14._12_4_ >> auVar79;
  uVar52 = (uint)(iVar5 < (int)uVar52) * iVar5 | (iVar5 >= (int)uVar52) * uVar52;
  uVar56 = (uint)(iVar5 < (int)uVar56) * iVar5 | (iVar5 >= (int)uVar56) * uVar56;
  uVar59 = (uint)(iVar5 < (int)uVar59) * iVar5 | (iVar5 >= (int)uVar59) * uVar59;
  uVar62 = (uint)(iVar5 < (int)uVar62) * iVar5 | (iVar5 >= (int)uVar62) * uVar62;
  iVar13 = (iVar11 - auVar17._0_4_) + auVar14._0_4_ >> auVar79;
  iVar8 = (iVar11 - auVar17._4_4_) + auVar14._4_4_ >> auVar79;
  iVar9 = (iVar11 - auVar17._8_4_) + auVar14._8_4_ >> auVar79;
  iVar10 = (iVar11 - auVar17._12_4_) + auVar14._12_4_ >> auVar79;
  iVar44 = uVar25 + uVar83;
  iVar45 = uVar28 + uVar87;
  iVar51 = uVar30 + uVar89;
  iVar55 = uVar32 + uVar91;
  iVar29 = uVar25 - uVar83;
  iVar31 = uVar28 - uVar87;
  iVar33 = uVar30 - uVar89;
  iVar35 = uVar32 - uVar91;
  iVar58 = uVar34 + iVar37;
  iVar61 = uVar36 + iVar39;
  iVar64 = uVar38 + iVar41;
  iVar66 = uVar40 + iVar43;
  iVar37 = uVar34 - iVar37;
  iVar39 = uVar36 - iVar39;
  iVar41 = uVar38 - iVar41;
  iVar43 = uVar40 - iVar43;
  iVar68 = iVar13 + uVar52;
  iVar70 = iVar8 + uVar56;
  iVar72 = iVar9 + uVar59;
  iVar74 = iVar10 + uVar62;
  iVar13 = uVar52 - iVar13;
  iVar8 = uVar56 - iVar8;
  iVar9 = uVar59 - iVar9;
  iVar10 = uVar62 - iVar10;
  iVar20 = uVar16 + uVar65;
  iVar22 = uVar19 + uVar67;
  iVar24 = uVar21 + uVar69;
  iVar27 = uVar23 + uVar71;
  iVar11 = uVar16 - uVar65;
  iVar12 = uVar19 - uVar67;
  iVar15 = uVar21 - uVar69;
  iVar18 = uVar23 - uVar71;
  uVar83 = (uint)(iVar44 < iVar7) * iVar7 | (uint)(iVar44 >= iVar7) * iVar44;
  uVar87 = (uint)(iVar45 < iVar7) * iVar7 | (uint)(iVar45 >= iVar7) * iVar45;
  uVar89 = (uint)(iVar51 < iVar7) * iVar7 | (uint)(iVar51 >= iVar7) * iVar51;
  uVar91 = (uint)(iVar55 < iVar7) * iVar7 | (uint)(iVar55 >= iVar7) * iVar55;
  uVar34 = (uint)(iVar29 < iVar7) * iVar7 | (uint)(iVar29 >= iVar7) * iVar29;
  uVar36 = (uint)(iVar31 < iVar7) * iVar7 | (uint)(iVar31 >= iVar7) * iVar31;
  uVar38 = (uint)(iVar33 < iVar7) * iVar7 | (uint)(iVar33 >= iVar7) * iVar33;
  uVar40 = (uint)(iVar35 < iVar7) * iVar7 | (uint)(iVar35 >= iVar7) * iVar35;
  uVar46 = (uint)(iVar58 < iVar7) * iVar7 | (uint)(iVar58 >= iVar7) * iVar58;
  uVar48 = (uint)(iVar61 < iVar7) * iVar7 | (uint)(iVar61 >= iVar7) * iVar61;
  uVar49 = (uint)(iVar64 < iVar7) * iVar7 | (uint)(iVar64 >= iVar7) * iVar64;
  uVar50 = (uint)(iVar66 < iVar7) * iVar7 | (uint)(iVar66 >= iVar7) * iVar66;
  uVar65 = (uint)(iVar37 < iVar7) * iVar7 | (uint)(iVar37 >= iVar7) * iVar37;
  uVar67 = (uint)(iVar39 < iVar7) * iVar7 | (uint)(iVar39 >= iVar7) * iVar39;
  uVar69 = (uint)(iVar41 < iVar7) * iVar7 | (uint)(iVar41 >= iVar7) * iVar41;
  uVar71 = (uint)(iVar43 < iVar7) * iVar7 | (uint)(iVar43 >= iVar7) * iVar43;
  uVar53 = (uint)(iVar68 < iVar7) * iVar7 | (uint)(iVar68 >= iVar7) * iVar68;
  uVar57 = (uint)(iVar70 < iVar7) * iVar7 | (uint)(iVar70 >= iVar7) * iVar70;
  uVar60 = (uint)(iVar72 < iVar7) * iVar7 | (uint)(iVar72 >= iVar7) * iVar72;
  uVar63 = (uint)(iVar74 < iVar7) * iVar7 | (uint)(iVar74 >= iVar7) * iVar74;
  uVar52 = (uint)(iVar13 < iVar7) * iVar7 | (uint)(iVar13 >= iVar7) * iVar13;
  uVar56 = (uint)(iVar8 < iVar7) * iVar7 | (uint)(iVar8 >= iVar7) * iVar8;
  uVar59 = (uint)(iVar9 < iVar7) * iVar7 | (uint)(iVar9 >= iVar7) * iVar9;
  uVar62 = (uint)(iVar10 < iVar7) * iVar7 | (uint)(iVar10 >= iVar7) * iVar10;
  uVar25 = (uint)(iVar20 < iVar7) * iVar7 | (uint)(iVar20 >= iVar7) * iVar20;
  uVar28 = (uint)(iVar22 < iVar7) * iVar7 | (uint)(iVar22 >= iVar7) * iVar22;
  uVar30 = (uint)(iVar24 < iVar7) * iVar7 | (uint)(iVar24 >= iVar7) * iVar24;
  uVar32 = (uint)(iVar27 < iVar7) * iVar7 | (uint)(iVar27 >= iVar7) * iVar27;
  uVar16 = (uint)(iVar11 < iVar7) * iVar7 | (uint)(iVar11 >= iVar7) * iVar11;
  uVar19 = (uint)(iVar12 < iVar7) * iVar7 | (uint)(iVar12 >= iVar7) * iVar12;
  uVar21 = (uint)(iVar15 < iVar7) * iVar7 | (uint)(iVar15 >= iVar7) * iVar15;
  uVar23 = (uint)(iVar18 < iVar7) * iVar7 | (uint)(iVar18 >= iVar7) * iVar18;
  uVar83 = (uint)(iVar5 < (int)uVar83) * iVar5 | (iVar5 >= (int)uVar83) * uVar83;
  uVar87 = (uint)(iVar5 < (int)uVar87) * iVar5 | (iVar5 >= (int)uVar87) * uVar87;
  uVar89 = (uint)(iVar5 < (int)uVar89) * iVar5 | (iVar5 >= (int)uVar89) * uVar89;
  uVar91 = (uint)(iVar5 < (int)uVar91) * iVar5 | (iVar5 >= (int)uVar91) * uVar91;
  uVar34 = (uint)(iVar5 < (int)uVar34) * iVar5 | (iVar5 >= (int)uVar34) * uVar34;
  uVar36 = (uint)(iVar5 < (int)uVar36) * iVar5 | (iVar5 >= (int)uVar36) * uVar36;
  uVar38 = (uint)(iVar5 < (int)uVar38) * iVar5 | (iVar5 >= (int)uVar38) * uVar38;
  uVar40 = (uint)(iVar5 < (int)uVar40) * iVar5 | (iVar5 >= (int)uVar40) * uVar40;
  uVar46 = (uint)(iVar5 < (int)uVar46) * iVar5 | (iVar5 >= (int)uVar46) * uVar46;
  uVar48 = (uint)(iVar5 < (int)uVar48) * iVar5 | (iVar5 >= (int)uVar48) * uVar48;
  uVar49 = (uint)(iVar5 < (int)uVar49) * iVar5 | (iVar5 >= (int)uVar49) * uVar49;
  uVar50 = (uint)(iVar5 < (int)uVar50) * iVar5 | (iVar5 >= (int)uVar50) * uVar50;
  uVar65 = (uint)(iVar5 < (int)uVar65) * iVar5 | (iVar5 >= (int)uVar65) * uVar65;
  uVar67 = (uint)(iVar5 < (int)uVar67) * iVar5 | (iVar5 >= (int)uVar67) * uVar67;
  uVar69 = (uint)(iVar5 < (int)uVar69) * iVar5 | (iVar5 >= (int)uVar69) * uVar69;
  uVar71 = (uint)(iVar5 < (int)uVar71) * iVar5 | (iVar5 >= (int)uVar71) * uVar71;
  uVar53 = (uint)(iVar5 < (int)uVar53) * iVar5 | (iVar5 >= (int)uVar53) * uVar53;
  uVar57 = (uint)(iVar5 < (int)uVar57) * iVar5 | (iVar5 >= (int)uVar57) * uVar57;
  uVar60 = (uint)(iVar5 < (int)uVar60) * iVar5 | (iVar5 >= (int)uVar60) * uVar60;
  uVar63 = (uint)(iVar5 < (int)uVar63) * iVar5 | (iVar5 >= (int)uVar63) * uVar63;
  uVar52 = (uint)(iVar5 < (int)uVar52) * iVar5 | (iVar5 >= (int)uVar52) * uVar52;
  uVar56 = (uint)(iVar5 < (int)uVar56) * iVar5 | (iVar5 >= (int)uVar56) * uVar56;
  uVar59 = (uint)(iVar5 < (int)uVar59) * iVar5 | (iVar5 >= (int)uVar59) * uVar59;
  uVar62 = (uint)(iVar5 < (int)uVar62) * iVar5 | (iVar5 >= (int)uVar62) * uVar62;
  uVar25 = (uint)(iVar5 < (int)uVar25) * iVar5 | (iVar5 >= (int)uVar25) * uVar25;
  uVar28 = (uint)(iVar5 < (int)uVar28) * iVar5 | (iVar5 >= (int)uVar28) * uVar28;
  uVar30 = (uint)(iVar5 < (int)uVar30) * iVar5 | (iVar5 >= (int)uVar30) * uVar30;
  uVar32 = (uint)(iVar5 < (int)uVar32) * iVar5 | (iVar5 >= (int)uVar32) * uVar32;
  uVar16 = (uint)(iVar5 < (int)uVar16) * iVar5 | (iVar5 >= (int)uVar16) * uVar16;
  uVar19 = (uint)(iVar5 < (int)uVar19) * iVar5 | (iVar5 >= (int)uVar19) * uVar19;
  uVar21 = (uint)(iVar5 < (int)uVar21) * iVar5 | (iVar5 >= (int)uVar21) * uVar21;
  uVar23 = (uint)(iVar5 < (int)uVar23) * iVar5 | (iVar5 >= (int)uVar23) * uVar23;
  *(uint *)*out = uVar83;
  *(uint *)((long)*out + 4) = uVar87;
  *(uint *)(*out + 1) = uVar89;
  *(uint *)((long)*out + 0xc) = uVar91;
  *(uint *)out[7] = uVar34;
  *(uint *)((long)out[7] + 4) = uVar36;
  *(uint *)(out[7] + 1) = uVar38;
  *(uint *)((long)out[7] + 0xc) = uVar40;
  *(uint *)out[1] = uVar46;
  *(uint *)((long)out[1] + 4) = uVar48;
  *(uint *)(out[1] + 1) = uVar49;
  *(uint *)((long)out[1] + 0xc) = uVar50;
  *(uint *)out[6] = uVar65;
  *(uint *)((long)out[6] + 4) = uVar67;
  *(uint *)(out[6] + 1) = uVar69;
  *(uint *)((long)out[6] + 0xc) = uVar71;
  *(uint *)out[2] = uVar53;
  *(uint *)((long)out[2] + 4) = uVar57;
  *(uint *)(out[2] + 1) = uVar60;
  *(uint *)((long)out[2] + 0xc) = uVar63;
  *(uint *)out[5] = uVar52;
  *(uint *)((long)out[5] + 4) = uVar56;
  *(uint *)(out[5] + 1) = uVar59;
  *(uint *)((long)out[5] + 0xc) = uVar62;
  *(uint *)out[3] = uVar25;
  *(uint *)((long)out[3] + 4) = uVar28;
  *(uint *)(out[3] + 1) = uVar30;
  *(uint *)((long)out[3] + 0xc) = uVar32;
  *(uint *)out[4] = uVar16;
  *(uint *)((long)out[4] + 4) = uVar19;
  *(uint *)(out[4] + 1) = uVar21;
  *(uint *)((long)out[4] + 0xc) = uVar23;
  if (do_cols == 0) {
    iVar5 = 10;
    if (10 < bd) {
      iVar5 = bd;
    }
    local_28 = 0x20 << ((byte)iVar5 & 0x1f);
    local_18 = -local_28;
    local_28 = local_28 + -1;
    if (out_shift != 0) {
      iVar5 = 1 << ((char)out_shift - 1U & 0x1f);
      auVar14 = ZEXT416((uint)out_shift);
      *(int *)*out = (int)(uVar83 + iVar5) >> auVar14;
      *(int *)((long)*out + 4) = (int)(uVar87 + iVar5) >> auVar14;
      *(int *)(*out + 1) = (int)(uVar89 + iVar5) >> auVar14;
      *(int *)((long)*out + 0xc) = (int)(uVar91 + iVar5) >> auVar14;
      *(int *)out[1] = (int)(uVar46 + iVar5) >> auVar14;
      *(int *)((long)out[1] + 4) = (int)(uVar48 + iVar5) >> auVar14;
      *(int *)(out[1] + 1) = (int)(uVar49 + iVar5) >> auVar14;
      *(int *)((long)out[1] + 0xc) = (int)(uVar50 + iVar5) >> auVar14;
      *(int *)out[2] = (int)(uVar53 + iVar5) >> auVar14;
      *(int *)((long)out[2] + 4) = (int)(uVar57 + iVar5) >> auVar14;
      *(int *)(out[2] + 1) = (int)(uVar60 + iVar5) >> auVar14;
      *(int *)((long)out[2] + 0xc) = (int)(uVar63 + iVar5) >> auVar14;
      *(int *)out[3] = (int)(uVar25 + iVar5) >> auVar14;
      *(int *)((long)out[3] + 4) = (int)(uVar28 + iVar5) >> auVar14;
      *(int *)(out[3] + 1) = (int)(uVar30 + iVar5) >> auVar14;
      *(int *)((long)out[3] + 0xc) = (int)(uVar32 + iVar5) >> auVar14;
      *(int *)out[4] = (int)(uVar16 + iVar5) >> auVar14;
      *(int *)((long)out[4] + 4) = (int)(uVar19 + iVar5) >> auVar14;
      *(int *)(out[4] + 1) = (int)(uVar21 + iVar5) >> auVar14;
      *(int *)((long)out[4] + 0xc) = (int)(uVar23 + iVar5) >> auVar14;
      *(int *)out[5] = (int)(uVar52 + iVar5) >> auVar14;
      *(int *)((long)out[5] + 4) = (int)(uVar56 + iVar5) >> auVar14;
      *(int *)(out[5] + 1) = (int)(uVar59 + iVar5) >> auVar14;
      *(int *)((long)out[5] + 0xc) = (int)(uVar62 + iVar5) >> auVar14;
      *(int *)out[6] = (int)(uVar65 + iVar5) >> auVar14;
      *(int *)((long)out[6] + 4) = (int)(uVar67 + iVar5) >> auVar14;
      *(int *)(out[6] + 1) = (int)(uVar69 + iVar5) >> auVar14;
      *(int *)((long)out[6] + 0xc) = (int)(uVar71 + iVar5) >> auVar14;
      *(int *)out[7] = (int)(uVar34 + iVar5) >> auVar14;
      *(int *)((long)out[7] + 4) = (int)(uVar36 + iVar5) >> auVar14;
      *(int *)(out[7] + 1) = (int)(uVar38 + iVar5) >> auVar14;
      *(int *)((long)out[7] + 0xc) = (int)(uVar40 + iVar5) >> auVar14;
    }
    iStack_24 = local_28;
    iStack_20 = local_28;
    iStack_1c = local_28;
    iStack_14 = local_18;
    iStack_10 = local_18;
    iStack_c = local_18;
    highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_18,(__m128i *)&local_28,8);
  }
  return;
}

Assistant:

static void idct8x8_new_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                               int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;
  __m128i x, y;

  // stage 0
  // stage 1
  // stage 2
  u0 = in[0];
  u1 = in[4];
  u2 = in[2];
  u3 = in[6];

  x = _mm_mullo_epi32(in[1], cospi56);
  y = _mm_mullo_epi32(in[7], cospim8);
  u4 = _mm_add_epi32(x, y);
  u4 = _mm_add_epi32(u4, rnding);
  u4 = _mm_srai_epi32(u4, bit);

  x = _mm_mullo_epi32(in[1], cospi8);
  y = _mm_mullo_epi32(in[7], cospi56);
  u7 = _mm_add_epi32(x, y);
  u7 = _mm_add_epi32(u7, rnding);
  u7 = _mm_srai_epi32(u7, bit);

  x = _mm_mullo_epi32(in[5], cospi24);
  y = _mm_mullo_epi32(in[3], cospim40);
  u5 = _mm_add_epi32(x, y);
  u5 = _mm_add_epi32(u5, rnding);
  u5 = _mm_srai_epi32(u5, bit);

  x = _mm_mullo_epi32(in[5], cospi40);
  y = _mm_mullo_epi32(in[3], cospi24);
  u6 = _mm_add_epi32(x, y);
  u6 = _mm_add_epi32(u6, rnding);
  u6 = _mm_srai_epi32(u6, bit);

  // stage 3
  x = _mm_mullo_epi32(u0, cospi32);
  y = _mm_mullo_epi32(u1, cospi32);
  v0 = _mm_add_epi32(x, y);
  v0 = _mm_add_epi32(v0, rnding);
  v0 = _mm_srai_epi32(v0, bit);

  v1 = _mm_sub_epi32(x, y);
  v1 = _mm_add_epi32(v1, rnding);
  v1 = _mm_srai_epi32(v1, bit);

  x = _mm_mullo_epi32(u2, cospi48);
  y = _mm_mullo_epi32(u3, cospim16);
  v2 = _mm_add_epi32(x, y);
  v2 = _mm_add_epi32(v2, rnding);
  v2 = _mm_srai_epi32(v2, bit);

  x = _mm_mullo_epi32(u2, cospi16);
  y = _mm_mullo_epi32(u3, cospi48);
  v3 = _mm_add_epi32(x, y);
  v3 = _mm_add_epi32(v3, rnding);
  v3 = _mm_srai_epi32(v3, bit);

  addsub_sse4_1(u4, u5, &v4, &v5, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u7, u6, &v7, &v6, &clamp_lo, &clamp_hi);

  // stage 4
  addsub_sse4_1(v0, v3, &u0, &u3, &clamp_lo, &clamp_hi);
  addsub_sse4_1(v1, v2, &u1, &u2, &clamp_lo, &clamp_hi);
  u4 = v4;
  u7 = v7;

  x = _mm_mullo_epi32(v5, cospi32);
  y = _mm_mullo_epi32(v6, cospi32);
  u6 = _mm_add_epi32(y, x);
  u6 = _mm_add_epi32(u6, rnding);
  u6 = _mm_srai_epi32(u6, bit);

  u5 = _mm_sub_epi32(y, x);
  u5 = _mm_add_epi32(u5, rnding);
  u5 = _mm_srai_epi32(u5, bit);

  // stage 5
  addsub_sse4_1(u0, u7, out + 0, out + 7, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u1, u6, out + 1, out + 6, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u2, u5, out + 2, out + 5, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u3, u4, out + 3, out + 4, &clamp_lo, &clamp_hi);

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    round_shift_4x4(out, out_shift);
    round_shift_4x4(out + 4, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 8);
  }
}